

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constexpr_parser.h
# Opt level: O3

char * absl::lts_20250127::str_format_internal::ConsumeConversion<false>
                 (char *pos,char *end,UnboundConversion *conv,int *next_arg)

{
  byte bVar1;
  Flags FVar2;
  bool bVar3;
  ulong uVar4;
  char *pcVar5;
  int iVar6;
  byte *pbVar7;
  Flags FVar8;
  byte *pbVar9;
  byte *pbVar10;
  int iVar11;
  ConvTag tag;
  ConvTag tag_1;
  FormatConversionChar local_42;
  ConvTag local_41;
  int *local_40;
  char *local_38;
  
  if (pos == end) {
    return (char *)0x0;
  }
  if (conv->flags != kBasic) {
    __assert_fail("conv->flags == Flags::kBasic",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/str_format/constexpr_parser.h"
                  ,0xee,
                  "const char *absl::str_format_internal::ConsumeConversion(const char *, const char *const, UnboundConversion *, int *) [is_positional = false]"
                 );
  }
  uVar4 = (ulong)*pos;
  pbVar9 = (byte *)(pos + 1);
  if (0x40 < (long)uVar4) {
    local_42 = ConvTagHolder::value[uVar4].tag_;
    goto LAB_0033cf16;
  }
  FVar8 = kBasic;
  local_40 = next_arg;
  local_38 = pos;
  if (*pos < '1') {
    do {
      local_41.tag_ = ConvTagHolder::value[uVar4 & 0xff].tag_;
      if ((local_41.tag_ & 0xe0) != 0xc0) {
        if ((char)uVar4 != '*') {
          if ((int)(uVar4 & 0xff) != 0x30) goto LAB_0033ce38;
          goto LAB_0033cd4c;
        }
        FVar8 = FVar8 | kNonBasic;
        conv->flags = FVar8;
        if (pbVar9 == (byte *)end) {
          return (char *)0x0;
        }
        uVar4 = (ulong)*pbVar9;
        iVar6 = *local_40;
        *local_40 = iVar6 + 1;
        if (iVar6 < 0) goto LAB_0033d080;
        pbVar9 = pbVar9 + 1;
        (conv->width).value_ = -2 - iVar6;
        goto LAB_0033ce38;
      }
      FVar2 = ConvTag::as_flags(&local_41);
      FVar8 = FVar8 | FVar2;
      conv->flags = FVar8;
      if (pbVar9 == (byte *)end) {
        return (char *)0x0;
      }
      bVar1 = *pbVar9;
      uVar4 = (ulong)bVar1;
      pbVar9 = pbVar9 + 1;
    } while ((char)bVar1 < '1');
  }
  if ((byte)uVar4 < 0x3a) {
LAB_0033cd4c:
    iVar6 = ((uint)uVar4 & 0xff) - 0x30;
    if (pbVar9 == (byte *)end) {
      conv->flags = FVar8 | kNonBasic;
    }
    else {
      pbVar10 = pbVar9 + 9;
      iVar11 = -8;
      do {
        bVar1 = *pbVar9;
        uVar4 = (ulong)bVar1;
        if ((byte)(bVar1 - 0x3a) < 0xf6) {
          if (bVar1 == 0x24) {
            if (*local_40 != 0) {
              return (char *)0x0;
            }
            *local_40 = -1;
            pcVar5 = ConsumeConversion<true>(local_38,end,conv,local_40);
            return pcVar5;
          }
          pbVar7 = pbVar9 + 1;
          break;
        }
        pbVar7 = pbVar10;
        if (iVar11 == 0) break;
        pbVar9 = pbVar9 + 1;
        iVar6 = (int)(char)bVar1 + iVar6 * 10 + -0x30;
        iVar11 = iVar11 + 1;
        pbVar7 = (byte *)end;
      } while (pbVar9 != (byte *)end);
      conv->flags = FVar8 | kNonBasic;
      pbVar9 = pbVar7;
      if (iVar6 < 0) goto LAB_0033d061;
    }
    FVar8 = FVar8 | kNonBasic;
    (conv->width).value_ = iVar6;
LAB_0033ce38:
    if ((char)uVar4 == '.') {
      conv->flags = FVar8 | kNonBasic;
      if (pbVar9 == (byte *)end) {
        return (char *)0x0;
      }
      pbVar10 = pbVar9 + 1;
      bVar1 = *pbVar9;
      uVar4 = (ulong)bVar1;
      if ((byte)(bVar1 - 0x30) < 10) {
        iVar6 = bVar1 - 0x30;
        pbVar7 = pbVar10;
        if (pbVar10 != (byte *)end) {
          iVar11 = -8;
          do {
            bVar1 = *pbVar10;
            uVar4 = (ulong)bVar1;
            if ((byte)(bVar1 - 0x3a) < 0xf6) {
              pbVar7 = pbVar10 + 1;
              break;
            }
            pbVar7 = pbVar9 + 10;
            if (iVar11 == 0) break;
            pbVar10 = pbVar10 + 1;
            iVar6 = (int)(char)bVar1 + iVar6 * 10 + -0x30;
            iVar11 = iVar11 + 1;
            pbVar7 = (byte *)end;
          } while (pbVar10 != (byte *)end);
          if (iVar6 < 0) {
LAB_0033d061:
            __assert_fail("value >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/str_format/constexpr_parser.h"
                          ,0x2e,
                          "void absl::str_format_internal::UnboundConversion::InputValue::set_value(int)"
                         );
          }
        }
        (conv->precision).value_ = iVar6;
        pbVar10 = pbVar7;
      }
      else {
        if (bVar1 == 0x2a) {
          if (pbVar10 == (byte *)end) {
            return (char *)0x0;
          }
          uVar4 = (ulong)*pbVar10;
          iVar6 = *local_40;
          *local_40 = iVar6 + 1;
          if (iVar6 < 0) {
LAB_0033d080:
            __assert_fail("value > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/str_format/constexpr_parser.h"
                          ,0x39,
                          "void absl::str_format_internal::UnboundConversion::InputValue::set_from_arg(int)"
                         );
          }
          pbVar9 = pbVar9 + 2;
          (conv->precision).value_ = -2 - iVar6;
          FVar8 = kLeft;
          goto LAB_0033cef8;
        }
        (conv->precision).value_ = 0;
      }
      FVar8 = kLeft;
      pbVar9 = pbVar10;
    }
  }
LAB_0033cef8:
  local_42 = ConvTagHolder::value[uVar4 & 0xff].tag_;
  next_arg = local_40;
  if (((char)uVar4 == 'v') && (FVar8 != kBasic)) {
    return (char *)0x0;
  }
LAB_0033cf16:
  if ((char)local_42 < '\0') {
    return (char *)0x0;
  }
  bVar3 = CheckFastPathSetting(conv);
  if (bVar3) {
    if ((char)local_42 < '\0') {
      __assert_fail("is_conv()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/str_format/constexpr_parser.h"
                    ,99,"FormatConversionChar absl::str_format_internal::ConvTag::as_conv() const");
    }
    conv->conv = local_42;
    iVar6 = *next_arg;
    *next_arg = iVar6 + 1;
    conv->arg_position = iVar6 + 1;
    return (char *)pbVar9;
  }
  __assert_fail("CheckFastPathSetting(*conv)",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/str_format/constexpr_parser.h"
                ,0x14d,
                "const char *absl::str_format_internal::ConsumeConversion(const char *, const char *const, UnboundConversion *, int *) [is_positional = false]"
               );
}

Assistant:

constexpr const char* ConsumeConversion(const char* pos, const char* const end,
                                        UnboundConversion* conv,
                                        int* next_arg) {
  const char* const original_pos = pos;
  char c = 0;
  // Read the next char into `c` and update `pos`. Returns false if there are
  // no more chars to read.
#define ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR()          \
  do {                                                  \
    if (ABSL_PREDICT_FALSE(pos == end)) return nullptr; \
    c = *pos++;                                         \
  } while (0)

  if (is_positional) {
    ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
    if (ABSL_PREDICT_FALSE(c < '1' || c > '9')) return nullptr;
    conv->arg_position = ParseDigits(c, pos, end);
    assert(conv->arg_position > 0);
    if (ABSL_PREDICT_FALSE(c != '$')) return nullptr;
  }

  ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();

  // We should start with the basic flag on.
  assert(conv->flags == Flags::kBasic);

  // Any non alpha character makes this conversion not basic.
  // This includes flags (-+ #0), width (1-9, *) or precision (.).
  // All conversion characters and length modifiers are alpha characters.
  if (c < 'A') {
    while (c <= '0') {
      auto tag = GetTagForChar(c);
      if (tag.is_flags()) {
        conv->flags = conv->flags | tag.as_flags();
        ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
      } else {
        break;
      }
    }

    if (c <= '9') {
      if (c >= '0') {
        int maybe_width = ParseDigits(c, pos, end);
        if (!is_positional && c == '$') {
          if (ABSL_PREDICT_FALSE(*next_arg != 0)) return nullptr;
          // Positional conversion.
          *next_arg = -1;
          return ConsumeConversion<true>(original_pos, end, conv, next_arg);
        }
        conv->flags = conv->flags | Flags::kNonBasic;
        conv->width.set_value(maybe_width);
      } else if (c == '*') {
        conv->flags = conv->flags | Flags::kNonBasic;
        ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
        if (is_positional) {
          if (ABSL_PREDICT_FALSE(c < '1' || c > '9')) return nullptr;
          conv->width.set_from_arg(ParseDigits(c, pos, end));
          if (ABSL_PREDICT_FALSE(c != '$')) return nullptr;
          ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
        } else {
          conv->width.set_from_arg(++*next_arg);
        }
      }
    }

    if (c == '.') {
      conv->flags = conv->flags | Flags::kNonBasic;
      ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
      if ('0' <= c && c <= '9') {
        conv->precision.set_value(ParseDigits(c, pos, end));
      } else if (c == '*') {
        ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
        if (is_positional) {
          if (ABSL_PREDICT_FALSE(c < '1' || c > '9')) return nullptr;
          conv->precision.set_from_arg(ParseDigits(c, pos, end));
          if (c != '$') return nullptr;
          ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
        } else {
          conv->precision.set_from_arg(++*next_arg);
        }
      } else {
        conv->precision.set_value(0);
      }
    }
  }

  auto tag = GetTagForChar(c);

  if (ABSL_PREDICT_FALSE(c == 'v' && conv->flags != Flags::kBasic)) {
    return nullptr;
  }

  if (ABSL_PREDICT_FALSE(!tag.is_conv())) {
    if (ABSL_PREDICT_FALSE(!tag.is_length())) return nullptr;

    // It is a length modifier.
    LengthMod length_mod = tag.as_length();
    ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
    if (c == 'h' && length_mod == LengthMod::h) {
      conv->length_mod = LengthMod::hh;
      ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
    } else if (c == 'l' && length_mod == LengthMod::l) {
      conv->length_mod = LengthMod::ll;
      ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
    } else {
      conv->length_mod = length_mod;
    }
    tag = GetTagForChar(c);

    if (ABSL_PREDICT_FALSE(c == 'v')) return nullptr;
    if (ABSL_PREDICT_FALSE(!tag.is_conv())) return nullptr;

    // `wchar_t` args are marked non-basic so `Bind()` will copy the length mod.
    if (conv->length_mod == LengthMod::l && c == 'c') {
      conv->flags = conv->flags | Flags::kNonBasic;
    }
  }
#undef ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR

  assert(CheckFastPathSetting(*conv));
  (void)(&CheckFastPathSetting);

  conv->conv = tag.as_conv();
  if (!is_positional) conv->arg_position = ++*next_arg;
  return pos;
}